

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult
testing::internal::EqHelper<false>::Compare<int,__0>
          (char *expected_expression,char *actual_expression,int *expected,anon_enum_32 *actual)

{
  char *__dest;
  pointer __dest_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar2;
  stringstream ss;
  String local_1e0;
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 local_1c0 [16];
  string local_1b0 [4];
  ios_base local_130 [264];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (*(int *)actual_expression == *expected) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    PrintToString<int>(local_1b0,(int *)actual_expression);
    __dest = (char *)operator_new__(local_1b0[0]._M_string_length + 1);
    memcpy(__dest,local_1b0[0]._M_dataplus._M_p,local_1b0[0]._M_string_length);
    __dest[local_1b0[0]._M_string_length] = '\0';
    local_1e0.length_ = local_1b0[0]._M_string_length;
    local_1e0.c_str_ = __dest;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::ostream::_M_insert<long_long>((longlong)&local_1b0[0].field_2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
    __dest_00 = (pointer)operator_new__(local_1c8 + 1);
    memcpy(__dest_00,local_1d0,local_1c8);
    __dest_00[local_1c8] = '\0';
    local_1b0[0]._M_string_length = local_1c8;
    local_1b0[0]._M_dataplus._M_p = __dest_00;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    AVar2 = EqFailure((internal *)expected_expression,"r","CUBEB_OK",&local_1e0,(String *)local_1b0,
                      false);
    sVar1 = AVar2.message_.ptr_;
    if (local_1b0[0]._M_dataplus._M_p != (pointer)0x0) {
      operator_delete__(local_1b0[0]._M_dataplus._M_p);
      sVar1.ptr_ = extraout_RDX;
    }
    if (local_1e0.c_str_ != (char *)0x0) {
      operator_delete__(local_1e0.c_str_);
      sVar1.ptr_ = extraout_RDX_00;
    }
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = expected_expression;
  return AVar2;
}

Assistant:

static AssertionResult Compare(const char* expected_expression,
                                 const char* actual_expression,
                                 const T1& expected,
                                 const T2& actual) {
    return CmpHelperEQ(expected_expression, actual_expression, expected,
                       actual);
  }